

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_brick_tec
          (REF_NODE ref_node,REF_CELL ref_cell,REF_LONG ncell_expected,REF_GLOB *l2c,REF_BOOL binary
          ,FILE *file)

{
  REF_STATUS RVar1;
  uint uVar2;
  uint uVar3;
  void *data;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  undefined8 uVar7;
  REF_LONG ref_private_status_reis_ai;
  REF_MPI ref_mpi;
  long lVar8;
  undefined4 in_register_00000084;
  int iVar9;
  REF_INT source;
  REF_LONG ref_private_status_reis_bi;
  REF_INT ncell;
  REF_INT part;
  REF_GLOB brick [8];
  int int_node_1;
  REF_GLOB globals [27];
  REF_INT nodes [27];
  int local_208;
  int local_204;
  void *local_200;
  REF_GLOB local_1f8 [4];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  long local_1b8;
  REF_NODE local_1b0;
  REF_MPI local_1a8;
  undefined4 local_19c;
  REF_GLOB *local_198;
  REF_LONG local_190;
  REF_GLOB local_188 [4];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  REF_INT local_a8 [30];
  
  ref_mpi = ref_node->ref_mpi;
  uVar3 = ref_cell->node_per;
  local_200 = (void *)(long)(int)uVar3;
  local_1b0 = ref_node;
  local_1a8 = ref_mpi;
  local_198 = l2c;
  local_190 = ncell_expected;
  if ((ref_mpi->id == 0) && (0 < ref_cell->max)) {
    iVar9 = 0;
    local_1b8 = 0;
    do {
      RVar1 = ref_cell_nodes(ref_cell,iVar9,local_a8);
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,local_1b0,iVar9,&local_204);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x209,"ref_gather_brick_tec",(ulong)uVar2,"part");
          return uVar2;
        }
        if (ref_mpi->id != local_204) goto LAB_00152463;
        if (0 < (int)uVar3) {
          uVar6 = 0;
          do {
            local_188[uVar6] = local_198[local_a8[uVar6]];
            uVar6 = uVar6 + 1;
          } while (uVar3 != uVar6);
        }
        switch(ref_cell->node_per) {
        case 4:
          local_1f8[0] = local_188[0];
          local_1f8[1] = local_188[1];
          local_1f8[2] = local_188[2];
          local_1f8[3] = local_188[2];
          local_1d8 = local_188[3];
          uStack_1d0 = local_188[3];
          local_1c8 = local_188[3];
          break;
        case 5:
          local_1f8[0] = local_188[0];
          local_1f8[1] = local_188[1];
          local_1f8[2] = local_188[2];
          local_1f8[3] = local_188[2];
          local_1d8 = local_188[3];
          uStack_1d0 = local_168;
          local_1c8 = local_168;
          uStack_1c0 = local_188[3];
          goto LAB_001523d5;
        case 6:
          local_1f8[0] = local_188[0];
          local_1f8[1] = local_188[1];
          local_1f8[2] = local_188[2];
          local_1f8[3] = local_188[2];
          local_1d8 = local_188[3];
          uStack_1d0 = local_168;
          local_1c8 = uStack_160;
          break;
        default:
          uVar7 = 0x21c;
LAB_001528e5:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar7,"ref_gather_brick_tec",6,"wrong nodes per cell");
          return 6;
        case 8:
          local_1f8[0] = local_188[0];
          local_1f8[1] = local_188[1];
          local_1f8[2] = local_188[2];
          local_1f8[3] = local_188[3];
          local_1d8 = local_168;
          uStack_1d0 = uStack_160;
          local_1c8 = local_158;
          uStack_1c0 = uStack_150;
          goto LAB_001523da;
        }
        uStack_1c0 = local_1c8;
LAB_001523d5:
        local_1d8 = local_188[3];
        local_1f8[2] = local_188[2];
        local_1f8[3] = local_1f8[2];
LAB_001523da:
        local_1f8[2] = local_188[2];
        local_1f8[1] = local_188[1];
        local_1f8[0] = local_188[0];
        lVar8 = 0;
        do {
          local_208 = (int)local_1f8[lVar8];
          sVar5 = fwrite(&local_208,4,1,(FILE *)CONCAT44(in_register_00000084,binary));
          if (sVar5 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x223,"ref_gather_brick_tec","int c2n",1,sVar5);
            return 1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        local_1b8 = local_1b8 + 1;
        ref_mpi = local_1a8;
      }
LAB_00152463:
      iVar9 = iVar9 + 1;
    } while (iVar9 < ref_cell->max);
  }
  else {
    local_1b8 = 0;
  }
  if (ref_mpi->id == 0) {
    if (1 < ref_mpi->n) {
      source = 1;
      do {
        uVar3 = ref_mpi_gather_recv(ref_mpi,&local_208,1,1,source);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x234,"ref_gather_brick_tec",(ulong)uVar3,"recv ncell");
          return uVar3;
        }
        uVar3 = local_208 * (int)local_200;
        if ((int)uVar3 < 0) {
          uVar7 = 0x235;
          goto LAB_0015280b;
        }
        data = malloc((ulong)uVar3 << 3);
        if (data == (void *)0x0) {
          uVar7 = 0x235;
          goto LAB_0015283b;
        }
        uVar3 = ref_mpi_gather_recv(ref_mpi,data,uVar3,2,source);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x238,"ref_gather_brick_tec",(ulong)uVar3,"recv c2n");
          return uVar3;
        }
        if (0 < local_208) {
          lVar8 = 0;
          local_1b0 = (REF_NODE)CONCAT44(local_1b0._4_4_,source);
          do {
            switch(ref_cell->node_per) {
            case 4:
              lVar4 = lVar8 * (long)local_200;
              local_1f8[0] = *(REF_GLOB *)((long)data + lVar4 * 8);
              local_1f8[1] = *(undefined8 *)((long)data + lVar4 * 8 + 8);
              local_1f8[2] = *(undefined8 *)((long)data + lVar4 * 8 + 0x10);
              local_1f8[3] = local_1f8[2];
              uStack_1c0 = *(undefined8 *)((long)data + lVar4 * 8 + 0x18);
              local_1d8 = uStack_1c0;
              uStack_1d0 = uStack_1c0;
              break;
            case 5:
              lVar4 = lVar8 * (long)local_200;
              local_1f8[0] = *(REF_GLOB *)((long)data + lVar4 * 8);
              local_1f8[1] = *(undefined8 *)((long)data + lVar4 * 8 + 8);
              local_1f8[2] = *(undefined8 *)((long)data + lVar4 * 8 + 0x10);
              local_1f8[3] = local_1f8[2];
              local_1d8 = *(undefined8 *)((long)data + lVar4 * 8 + 0x18);
              uStack_1d0 = *(undefined8 *)((long)data + lVar4 * 8 + 0x20);
              local_1c8 = uStack_1d0;
              uStack_1c0 = local_1d8;
              goto LAB_001526ba;
            case 6:
              lVar4 = lVar8 * (long)local_200;
              local_1f8[0] = *(REF_GLOB *)((long)data + lVar4 * 8);
              local_1f8[1] = *(undefined8 *)((long)data + lVar4 * 8 + 8);
              local_1f8[2] = *(undefined8 *)((long)data + lVar4 * 8 + 0x10);
              local_1f8[3] = local_1f8[2];
              local_1d8 = *(undefined8 *)((long)data + lVar4 * 8 + 0x18);
              uStack_1d0 = *(undefined8 *)((long)data + lVar4 * 8 + 0x20);
              uStack_1c0 = *(undefined8 *)((long)data + lVar4 * 8 + 0x28);
              break;
            default:
              uVar7 = 0x248;
              goto LAB_001528e5;
            case 8:
              lVar4 = lVar8 * (long)local_200;
              local_1f8[0] = *(REF_GLOB *)((long)data + lVar4 * 8);
              local_1f8[1] = *(undefined8 *)((long)data + lVar4 * 8 + 8);
              local_1f8[2] = *(undefined8 *)((long)data + lVar4 * 8 + 0x10);
              local_1f8[3] = *(undefined8 *)((long)data + lVar4 * 8 + 0x18);
              local_1d8 = *(undefined8 *)((long)data + lVar4 * 8 + 0x20);
              uStack_1d0 = *(undefined8 *)((long)data + lVar4 * 8 + 0x28);
              local_1c8 = *(undefined8 *)((long)data + lVar4 * 8 + 0x30);
              uStack_1c0 = *(undefined8 *)((long)data + lVar4 * 8 + 0x38);
              goto LAB_001526b5;
            }
            local_1c8 = uStack_1c0;
            local_1f8[2] = local_1f8[3];
LAB_001526b5:
LAB_001526ba:
            lVar4 = 0;
            do {
              local_19c = (undefined4)local_1f8[lVar4];
              sVar5 = fwrite(&local_19c,4,1,(FILE *)CONCAT44(in_register_00000084,binary));
              if (sVar5 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x24f,"ref_gather_brick_tec","int c2n",1,sVar5);
                return 1;
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 != 8);
            local_1b8 = local_1b8 + 1;
            lVar8 = lVar8 + 1;
            source = (int)local_1b0;
          } while (lVar8 < local_208);
        }
        free(data);
        source = source + 1;
        ref_mpi = local_1a8;
      } while (source < local_1a8->n);
    }
  }
  else {
    local_208 = 0;
    if (0 < ref_cell->max) {
      iVar9 = 0;
      do {
        RVar1 = ref_cell_nodes(ref_cell,iVar9,local_a8);
        if (RVar1 == 0) {
          uVar2 = ref_cell_part(ref_cell,local_1b0,iVar9,&local_204);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x25f,"ref_gather_brick_tec",(ulong)uVar2,"part");
            return uVar2;
          }
          ref_mpi = local_1a8;
          if (local_1a8->id == local_204) {
            local_208 = local_208 + 1;
          }
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < ref_cell->max);
    }
    uVar2 = ref_mpi_gather_send(ref_mpi,&local_208,1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x262,"ref_gather_brick_tec",(ulong)uVar2,"send ncell");
      return uVar2;
    }
    if (local_208 * (int)local_200 < 0) {
      uVar7 = 0x263;
LAB_0015280b:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar7,"ref_gather_brick_tec","malloc c2n of REF_GLOB negative");
      return 1;
    }
    local_200 = malloc((ulong)(uint)(local_208 * (int)local_200) << 3);
    if (local_200 == (void *)0x0) {
      uVar7 = 0x263;
      local_200 = (void *)0x0;
LAB_0015283b:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar7,"ref_gather_brick_tec","malloc c2n of REF_GLOB NULL");
      return 2;
    }
    local_208 = 0;
    if (0 < ref_cell->max) {
      iVar9 = 0;
      do {
        RVar1 = ref_cell_nodes(ref_cell,iVar9,local_a8);
        if (RVar1 == 0) {
          uVar2 = ref_cell_part(ref_cell,local_1b0,iVar9,&local_204);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x266,"ref_gather_brick_tec",(ulong)uVar2,"part");
            return uVar2;
          }
          ref_mpi = local_1a8;
          if (local_1a8->id == local_204) {
            if (0 < (int)uVar3) {
              uVar6 = 0;
              do {
                *(REF_GLOB *)((long)local_200 + uVar6 * 8 + (long)(int)uVar3 * (long)local_208 * 8)
                     = local_198[local_a8[uVar6]];
                uVar6 = uVar6 + 1;
              } while (uVar3 != uVar6);
            }
            local_208 = local_208 + 1;
          }
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < ref_cell->max);
    }
    uVar3 = ref_mpi_gather_send(ref_mpi,local_200,local_208 * uVar3,2);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x26e,"ref_gather_brick_tec",(ulong)uVar3,"send c2n");
      return uVar3;
    }
    free(local_200);
  }
  if ((ref_mpi->id == 0) && (local_1b8 != local_190)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x274,
           "ref_gather_brick_tec","cell count mismatch",local_190,local_1b8);
    RVar1 = 1;
  }
  else {
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_brick_tec(REF_NODE ref_node,
                                               REF_CELL ref_cell,
                                               REF_LONG ncell_expected,
                                               REF_GLOB *l2c, REF_BOOL binary,
                                               FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB brick[8];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_GLOB *c2n;
  REF_INT proc, part, ncell;
  REF_LONG ncell_actual;

  ncell_actual = 0;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++) {
          globals[node] = l2c[nodes[node]];
        }
        switch (ref_cell_node_per(ref_cell)) {
          case 4:
            REF_CELL_TEC_BRICK_TET(brick, globals);
            break;
          case 5:
            REF_CELL_TEC_BRICK_PYR(brick, globals);
            break;
          case 6:
            REF_CELL_TEC_BRICK_PRI(brick, globals);
            break;
          case 8:
            REF_CELL_TEC_BRICK_HEX(brick, globals);
            break;
          default:
            RSS(REF_IMPLEMENT, "wrong nodes per cell");
            break;
        }
        if (binary) {
          for (node = 0; node < 8; node++) {
            int int_node;
            int_node = (int)brick[node]; /* binary zero-based */
            REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
          }
        } else {
          for (node = 0; node < 8; node++) {
            brick[node]++; /* ascii one-based */
            fprintf(file, " " REF_GLOB_FMT, brick[node]);
          }
          fprintf(file, "\n");
        }
        ncell_actual++;
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");
      for (cell = 0; cell < ncell; cell++) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:
            REF_CELL_TEC_BRICK_TET(brick, &(c2n[node_per * cell]));
            break;
          case 5:
            REF_CELL_TEC_BRICK_PYR(brick, &(c2n[node_per * cell]));
            break;
          case 6:
            REF_CELL_TEC_BRICK_PRI(brick, &(c2n[node_per * cell]));
            break;
          case 8:
            REF_CELL_TEC_BRICK_HEX(brick, &(c2n[node_per * cell]));
            break;
          default:
            RSS(REF_IMPLEMENT, "wrong nodes per cell");
            break;
        }
        if (binary) {
          for (node = 0; node < 8; node++) {
            int int_node;
            int_node = (int)brick[node]; /* binary zero-based */
            REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
          }
        } else {
          for (node = 0; node < 8; node++) {
            brick[node]++; /* ascii one-based */
            fprintf(file, " " REF_GLOB_FMT, brick[node]);
          }
          fprintf(file, "\n");
        }
        ncell_actual++;
      }
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) ncell++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++)
          c2n[node + node_per * ncell] = l2c[nodes[node]];
        ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");

    ref_free(c2n);
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}